

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  reference ppFVar4;
  value_type desc;
  value_type field_00;
  FieldGenerator *pFVar5;
  Iterator IVar6;
  Iterator IVar7;
  value_type field_1;
  Iterator __end4;
  Iterator __begin4;
  FieldRangeImpl<google::protobuf::OneofDescriptor> *__range4;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  bool need_registration;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  bVar1 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar1) {
    Formatter::Formatter
              ((Formatter *)local_50,
               (Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &this->variables_);
    Formatter::operator()<>((Formatter *)local_50,"void $classname$::ArenaDtor(void* object) {\n");
    Formatter::Indent((Formatter *)local_50);
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n");
    bVar1 = false;
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar2) {
      ppFVar4 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar4);
      uVar3 = (*pFVar5->_vptr_FieldGenerator[0x11])
                        (pFVar5,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((uVar3 & 1) != 0) {
        bVar1 = true;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar6 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar6.descriptor;
    __end3_1.descriptor._0_4_ = IVar6.idx;
    IVar6 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar6.descriptor;
    oneof._0_4_ = IVar6.idx;
    while (bVar2 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar2) {
      desc = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
      __begin4.descriptor = (OneofDescriptor *)FieldRange<google::protobuf::OneofDescriptor>(desc);
      IVar7 = FieldRangeImpl<google::protobuf::OneofDescriptor>::begin
                        ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
      __begin4._0_8_ = IVar7.descriptor;
      __end4.descriptor._0_4_ = IVar7.idx;
      IVar7 = FieldRangeImpl<google::protobuf::OneofDescriptor>::end
                        ((FieldRangeImpl<google::protobuf::OneofDescriptor> *)&__begin4.descriptor);
      __end4._0_8_ = IVar7.descriptor;
      field_1._0_4_ = IVar7.idx;
      while (bVar2 = cpp::operator!=((Iterator *)&__end4.descriptor,(Iterator *)&field_1), bVar2) {
        field_00 = FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator*
                             ((Iterator *)&__end4.descriptor);
        bVar2 = IsFieldStripped(field_00,&this->options_);
        if (!bVar2) {
          pFVar5 = FieldGeneratorMap::get(&this->field_generators_,field_00);
          uVar3 = (*pFVar5->_vptr_FieldGenerator[0x11])
                            (pFVar5,format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if ((uVar3 & 1) != 0) {
            bVar1 = true;
          }
        }
        FieldRangeImpl<google::protobuf::OneofDescriptor>::Iterator::operator++
                  ((Iterator *)&__end4.descriptor);
      }
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
    }
    Formatter::Outdent((Formatter *)local_50);
    Formatter::operator()<>((Formatter *)local_50,"}\n");
    if (bVar1) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* arena) {\n  if (arena != nullptr) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
                );
    }
    else {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n}\n");
    }
    Formatter::~Formatter((Formatter *)local_50);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateArenaDestructorCode(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  format("void $classname$::ArenaDtor(void* object) {\n");
  format.Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  format(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n");

  bool need_registration = false;
  // Process non-oneof fields first.
  for (auto field : optimized_order_) {
    if (field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (auto oneof : OneOfRange(descriptor_)) {
    for (auto field : FieldRange(oneof)) {
      if (!IsFieldStripped(field, options_) &&
          field_generators_.get(field).GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }

  format.Outdent();
  format("}\n");

  if (need_registration) {
    format(
        "inline void $classname$::RegisterArenaDtor(::$proto_ns$::Arena* "
        "arena) {\n"
        "  if (arena != nullptr) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n");
  } else {
    format(
        "void $classname$::RegisterArenaDtor(::$proto_ns$::Arena*) {\n"
        "}\n");
  }
}